

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

optional<pbrt::LightLiSample> * __thiscall
pbrt::SpotLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,SpotLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [56];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  Vector3f wl;
  SampledSpectrum SVar30;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  undefined1 auVar19 [56];
  undefined1 auVar22 [64];
  
  auVar15 = ZEXT816(0) << 0x40;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0)),
                           auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]))
  ;
  auVar6 = vfmadd231ss_fma(auVar6,auVar15,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  fVar3 = auVar6._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0)),
                           auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]))
  ;
  auVar6 = vfmadd231ss_fma(auVar6,auVar15,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  fVar13 = auVar6._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]))
  ;
  auVar6 = vfmadd231ss_fma(auVar6,auVar15,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar14 = vfmadd231ss_fma(auVar14,auVar15,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar29 = auVar14._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar2 = fVar29 == 1.0;
  fVar26 = auVar6._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  fVar28 = fVar3 / fVar29;
  fVar27 = fVar13 / fVar29;
  fVar29 = fVar26 / fVar29;
  auVar8._16_48_ = in_ZmmResult._16_48_;
  auVar8._0_16_ = ZEXT416((uint)fVar28);
  auVar7._4_60_ = auVar8._4_60_;
  auVar7._0_4_ = (uint)bVar2 * (int)fVar3 + (uint)!bVar2 * (int)fVar28;
  local_38 = auVar7._0_16_;
  auVar10._16_48_ = auVar8._16_48_;
  auVar10._0_16_ = ZEXT416((uint)fVar27);
  auVar9._4_60_ = auVar10._4_60_;
  auVar9._0_4_ = (uint)bVar2 * (int)fVar13 + (uint)!bVar2 * (int)fVar27;
  auVar12._16_48_ = auVar8._16_48_;
  auVar12._0_16_ = ZEXT416((uint)fVar29);
  auVar11._4_60_ = auVar12._4_60_;
  auVar11._0_4_ = (float)((uint)bVar2 * (int)fVar26 + (uint)!bVar2 * (int)fVar29);
  local_58 = auVar11._0_16_;
  local_48 = vinsertps_avx(local_38,auVar9._0_16_,0x10);
  auVar6 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar14._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
       auVar6._0_4_;
  auVar14._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar6._4_4_;
  auVar14._8_4_ = auVar6._8_4_ + 0.0;
  auVar14._12_4_ = auVar6._12_4_ + 0.0;
  auVar6._8_4_ = 0xbf000000;
  auVar6._0_8_ = 0xbf000000bf000000;
  auVar6._12_4_ = 0xbf000000;
  auVar6 = vmulps_avx512vl(auVar14,auVar6);
  auVar24._0_4_ = local_48._0_4_ + auVar6._0_4_;
  auVar24._4_4_ = local_48._4_4_ + auVar6._4_4_;
  auVar24._8_4_ = local_48._8_4_ + auVar6._8_4_;
  auVar24._12_4_ = local_48._12_4_ + auVar6._12_4_;
  auVar15._0_4_ = auVar24._0_4_ * auVar24._0_4_;
  auVar15._4_4_ = auVar24._4_4_ * auVar24._4_4_;
  auVar15._8_4_ = auVar24._8_4_ * auVar24._8_4_;
  auVar15._12_4_ = auVar24._12_4_ * auVar24._12_4_;
  auVar6 = vhaddps_avx(auVar15,auVar15);
  fVar3 = auVar11._0_4_ +
          (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
          -0.5;
  fVar13 = auVar6._0_4_ + fVar3 * fVar3;
  local_28 = ZEXT416((uint)fVar13);
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    auVar6 = vsqrtss_avx(local_28,local_28);
    fVar13 = auVar6._0_4_;
  }
  auVar16._4_4_ = fVar13;
  auVar16._0_4_ = fVar13;
  auVar16._8_4_ = fVar13;
  auVar16._12_4_ = fVar13;
  auVar6 = vdivps_avx(auVar24,auVar16);
  auVar14 = vmovshdup_avx(auVar6);
  auVar16 = ZEXT416((uint)(fVar3 / fVar13));
  fVar29 = auVar14._0_4_;
  auVar14 = vfnmsub231ss_fma(ZEXT416((uint)(fVar29 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [0][1])),auVar6,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar14 = vfnmadd231ss_fma(auVar14,auVar16,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar15 = vfnmsub231ss_fma(ZEXT416((uint)(fVar29 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [1][1])),auVar6,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar15 = vfnmadd231ss_fma(auVar15,auVar16,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar24 = vfnmsub231ss_fma(ZEXT416((uint)(fVar29 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [2][1])),auVar6,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar24 = vfnmadd231ss_fma(auVar24,auVar16,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar26 = auVar14._0_4_;
  fVar27 = auVar15._0_4_;
  fVar28 = auVar24._0_4_;
  fVar29 = fVar26 * fVar26 + fVar27 * fVar27 + fVar28 * fVar28;
  if (fVar29 < 0.0) {
    fVar29 = sqrtf(fVar29);
    auVar24 = ZEXT416((uint)fVar28);
    auVar15 = ZEXT416((uint)fVar27);
    auVar14 = ZEXT416((uint)fVar26);
  }
  else {
    auVar16 = vsqrtss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
    fVar29 = auVar16._0_4_;
  }
  auVar20._0_4_ = auVar14._0_4_ / fVar29;
  auVar20._4_12_ = auVar14._4_12_;
  auVar25._0_4_ = auVar15._0_4_ / fVar29;
  auVar25._4_12_ = auVar15._4_12_;
  auVar14 = vinsertps_avx(auVar20,auVar25,0x10);
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar24._0_4_ / fVar29;
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar14._0_8_;
  auVar23 = ZEXT856(auVar24._8_8_);
  auVar19 = ZEXT856(auVar14._8_8_);
  SVar30 = I(this,wl,&lambda);
  auVar22._0_8_ = SVar30.values.values._8_8_;
  auVar22._8_56_ = auVar23;
  auVar18._0_8_ = SVar30.values.values._0_8_;
  auVar18._8_56_ = auVar19;
  auVar14 = vmovlhps_avx(auVar18._0_16_,auVar22._0_16_);
  auVar21._4_4_ = local_28._0_4_;
  auVar21._0_4_ = local_28._0_4_;
  auVar21._8_4_ = local_28._0_4_;
  auVar21._12_4_ = local_28._0_4_;
  auVar14 = vdivps_avx(auVar14,auVar21);
  local_68._0_4_ = auVar14._0_4_;
  if (((float)local_68 == 0.0) && (!NAN((float)local_68))) {
    uVar4 = 0;
    while (uVar5 = uVar4, uVar5 != 3) {
      fVar29 = *(float *)((long)&local_68 + uVar5 * 4 + 4);
      if ((fVar29 != 0.0) || (uVar4 = uVar5 + 1, NAN(fVar29))) break;
    }
    if (2 < uVar5) {
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
      *(undefined8 *)&__return_storage_ptr__->set = 0;
      (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
      return __return_storage_ptr__;
    }
  }
  auVar17._4_4_ = local_58._0_4_;
  auVar17._0_4_ = local_58._0_4_;
  auVar17._8_4_ = local_58._0_4_;
  auVar17._12_4_ = local_58._0_4_;
  *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) = ZEXT432(0) << 0x20;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  local_68 = auVar14._0_8_;
  uStack_60 = auVar14._8_8_;
  (__return_storage_ptr__->optionalValue).__align = local_68;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_60;
  __return_storage_ptr__->set = true;
  uVar1 = vmovlps_avx(auVar6);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar3 / fVar13;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  auVar6 = vshufps_avx(local_38,local_48,0x50);
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar6;
  uVar1 = vmovlps_avx(auVar17);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        Point3f p = renderFromLight(Point3f(0, 0, 0));
        Vector3f wi = Normalize(p - ctx.p());
        // Compute incident radiance _Li_ for _SpotLight_
        Vector3f wl = Normalize(renderFromLight.ApplyInverse(-wi));
        SampledSpectrum Li = I(wl, lambda) / DistanceSquared(p, ctx.p());

        if (!Li)
            return {};
        return LightLiSample(Li, wi, 1, Interaction(p, &mediumInterface));
    }